

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FACopyDescriptor.H
# Opt level: O0

FillBoxId * __thiscall
amrex::FabArrayCopyDescriptor<amrex::FArrayBox>::AddBox
          (FabArrayCopyDescriptor<amrex::FArrayBox> *this,FabArrayId fabarrayid,Box *destFabBox,
          BoxList *returnedUnfilledBoxes,int fabarrayindex,int srccomp,int destcomp,int numcomp,
          bool bUseValidBox)

{
  int newid;
  Box *in_RCX;
  long in_RSI;
  FillBoxId *in_RDI;
  long in_R8;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000018;
  byte in_stack_00000020;
  BoxDomain unfilledBoxDomain;
  Box *in_stack_00000108;
  BoxDomain *in_stack_00000110;
  bool in_stack_0000017f;
  int in_stack_00000180;
  int in_stack_00000184;
  BoxList *in_stack_00000188;
  Box *in_stack_00000190;
  FabArrayCopyDescriptor<amrex::FArrayBox> *in_stack_00000198;
  FabArrayId in_stack_000001a4;
  int in_stack_000001b0;
  int in_stack_000001b8;
  BoxDomain *in_stack_000001c8;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  IndexType in_stack_ffffffffffffff54;
  BoxDomain local_58;
  byte local_35;
  long local_30;
  Box *local_28;
  
  local_35 = in_stack_00000020 & 1;
  local_30 = in_R8;
  local_28 = in_RCX;
  Box::ixType(in_RCX);
  BoxDomain::BoxDomain
            ((BoxDomain *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             in_stack_ffffffffffffff54);
  if (local_30 != 0) {
    BoxDomain::add(in_stack_00000110,in_stack_00000108);
  }
  AddBoxDoIt(in_stack_00000198,in_stack_000001a4,in_stack_00000190,in_stack_00000188,
             in_stack_00000184,in_stack_00000180,in_stack_000001b0,in_stack_000001b8,
             in_stack_0000017f,in_stack_000001c8);
  if (local_30 != 0) {
    BoxList::clear((BoxList *)0x5b39de);
    BoxDomain::boxList(&local_58);
    BoxList::operator=((BoxList *)CONCAT44(in_stack_ffffffffffffff54.itype,in_stack_00000018),
                       (BoxList *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_00000010));
  }
  newid = *(int *)(in_RSI + 0x48);
  *(int *)(in_RSI + 0x48) = newid + 1;
  FillBoxId::FillBoxId(in_RDI,newid,local_28);
  BoxDomain::~BoxDomain((BoxDomain *)0x5b3a34);
  return in_RDI;
}

Assistant:

FillBoxId
FabArrayCopyDescriptor<FAB>::AddBox (FabArrayId fabarrayid,
                                     const Box& destFabBox,
                                     BoxList*   returnedUnfilledBoxes,
                                     int        fabarrayindex,
                                     int        srccomp,
                                     int        destcomp,
                                     int        numcomp,
                                     bool       bUseValidBox)
{
    BoxDomain unfilledBoxDomain(destFabBox.ixType());

    if (returnedUnfilledBoxes != 0)
    {
        unfilledBoxDomain.add(destFabBox);
    }

    AddBoxDoIt(fabarrayid,
               destFabBox,
               returnedUnfilledBoxes,
               fabarrayindex,
               srccomp,
               destcomp,
               numcomp,
               bUseValidBox,
               unfilledBoxDomain);

    if (returnedUnfilledBoxes != 0)
    {
        returnedUnfilledBoxes->clear();
        (*returnedUnfilledBoxes) = unfilledBoxDomain.boxList();
    }

    return FillBoxId(nextFillBoxId++, destFabBox);
}